

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void google::InstallFailureSignalHandler(void)

{
  _func_void **this;
  int iVar1;
  ostream *poVar2;
  SendMethod in_R9;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auStack_e8 [8];
  sigaction sig_action;
  
  auVar4 = ZEXT816(0) << 0x40;
  _auStack_e8 = ZEXT1664(auVar4);
  sig_action.sa_mask.__val[0xe] = 0;
  sig_action.sa_mask.__val[0xf]._0_1_ = 0;
  sig_action._129_15_ = (undefined1  [15])0x0;
  sig_action.sa_mask.__val[8] = 0;
  sig_action.sa_mask.__val[6] = auVar4._0_8_;
  sig_action.sa_mask.__val[7] = auVar4._8_8_;
  sig_action.sa_mask.__val[9] = 0;
  sig_action.sa_mask.__val[10] = 0;
  sig_action.sa_mask.__val[0xb] = 0;
  sig_action.sa_mask.__val[0xc] = 0;
  sig_action.sa_mask.__val[0xd] = 0;
  sigemptyset((sigset_t *)&sig_action);
  sig_action.sa_mask.__val[0xf]._0_1_ = (byte)sig_action.sa_mask.__val[0xf] | 4;
  this = &sig_action.sa_restorer;
  auStack_e8 = (undefined1  [8])anon_unknown_0::FailureSignalHandler;
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x10) {
    iVar1 = sigaction(*(int *)((long)&(anonymous_namespace)::kFailureSignals + lVar3),
                      (sigaction *)auStack_e8,(sigaction *)0x0);
    if (iVar1 == -1) {
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)this,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/signalhandler.cc"
                 ,0x185,3,0,in_R9);
      poVar2 = LogMessage::stream((LogMessage *)this);
      std::operator<<(poVar2,"sigaction(kFailureSignals[i].number, &sig_action, NULL)");
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)this);
    }
  }
  return;
}

Assistant:

void InstallFailureSignalHandler() {
#ifdef HAVE_SIGACTION
  // Build the sigaction struct.
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sig_action.sa_flags |= SA_SIGINFO;
  sig_action.sa_sigaction = &FailureSignalHandler;

  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_ERR(sigaction(kFailureSignals[i].number, &sig_action, NULL));
  }
  kFailureSignalHandlerInstalled = true;
#elif defined(GLOG_OS_WINDOWS)
  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_NE(signal(kFailureSignals[i].number, &FailureSignalHandler),
             SIG_ERR);
  }
  kFailureSignalHandlerInstalled = true;
#endif  // HAVE_SIGACTION
}